

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

bool getFunctionNameAndStartLineForAddress
               (DWARFCompileUnit *CU,uint64_t Address,FunctionNameKind Kind,string *FunctionName,
               uint32_t *StartLine)

{
  uint *puVar1;
  undefined1 this [8];
  undefined1 uVar2;
  undefined1 extraout_AL;
  uint64_t extraout_RAX;
  char *__s;
  uint64_t uVar3;
  undefined1 local_88 [8];
  SmallVector<llvm::DWARFDie,_4U> InlinedChain;
  
  puVar1 = &InlinedChain.super_SmallVectorImpl<llvm::DWARFDie>.
            super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
            super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size;
  InlinedChain.super_SmallVectorImpl<llvm::DWARFDie>.
  super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.BeginX =
       (void *)0x400000000;
  local_88 = (undefined1  [8])puVar1;
  llvm::DWARFUnit::getInlinedChainForAddress
            (&CU->super_DWARFUnit,Address,(SmallVectorImpl<llvm::DWARFDie> *)local_88);
  this = local_88;
  uVar3 = extraout_RAX;
  if ((int)InlinedChain.super_SmallVectorImpl<llvm::DWARFDie>.
           super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.BeginX != 0)
  {
    if (Kind != None) {
      __s = llvm::DWARFDie::getSubroutineName((DWARFDie *)local_88,Kind);
      if (__s != (char *)0x0) {
        InlinedChain.super_SmallVectorStorage<llvm::DWARFDie,_4U>.InlineElts[3].buffer._8_8_ =
             FunctionName->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace
                  ((ulong)FunctionName,0,
                   (char *)InlinedChain.super_SmallVectorStorage<llvm::DWARFDie,_4U>.InlineElts[3].
                           buffer._8_8_,(ulong)__s);
      }
    }
    uVar3 = llvm::DWARFDie::getDeclLine((DWARFDie *)this);
    if (uVar3 != 0) {
      *StartLine = (uint32_t)uVar3;
    }
  }
  uVar2 = (undefined1)uVar3;
  if (local_88 != (undefined1  [8])puVar1) {
    free((void *)local_88);
    uVar2 = extraout_AL;
  }
  return (bool)uVar2;
}

Assistant:

static bool getFunctionNameAndStartLineForAddress(DWARFCompileUnit *CU,
                                                  uint64_t Address,
                                                  FunctionNameKind Kind,
                                                  std::string &FunctionName,
                                                  uint32_t &StartLine) {
  // The address may correspond to instruction in some inlined function,
  // so we have to build the chain of inlined functions and take the
  // name of the topmost function in it.
  SmallVector<DWARFDie, 4> InlinedChain;
  CU->getInlinedChainForAddress(Address, InlinedChain);
  if (InlinedChain.empty())
    return false;

  const DWARFDie &DIE = InlinedChain[0];
  bool FoundResult = false;
  const char *Name = nullptr;
  if (Kind != FunctionNameKind::None && (Name = DIE.getSubroutineName(Kind))) {
    FunctionName = Name;
    FoundResult = true;
  }
  if (auto DeclLineResult = DIE.getDeclLine()) {
    StartLine = DeclLineResult;
    FoundResult = true;
  }

  return FoundResult;
}